

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O1

FileInfoWrapper<ASDCP::JP2K::MXFSReader,_MyStereoPictureDescriptor> * __thiscall
FileInfoWrapper<ASDCP::JP2K::MXFSReader,_MyStereoPictureDescriptor>::file_info
          (FileInfoWrapper<ASDCP::JP2K::MXFSReader,_MyStereoPictureDescriptor> *this,
          CommandOptions *Options,char *type_string,IFileReaderFactory *fileReaderFactory,
          FILE *stream)

{
  MXFSReader Reader;
  WriterInfo WI;
  MyStereoPictureDescriptor Desc;
  undefined1 auStack_398 [16];
  char **local_388 [2];
  char *local_378 [7];
  _Alloc_hider local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  _Alloc_hider local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  undefined1 local_2d8 [208];
  PictureDescriptor local_208;
  
  if (type_string != (char *)0x0) {
    if (stream == (FILE *)0x0) {
      stream = (FILE *)_stdout;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    if ((Options->verbose_flag != false) || (Options->showheader_flag == true)) {
      ASDCP::JP2K::MXFSReader::MXFSReader((MXFSReader *)auStack_398,fileReaderFactory);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_388,Options->filenames[0],(allocator<char> *)local_2d8);
      ASDCP::JP2K::MXFSReader::OpenRead((string *)&local_208);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_208);
      Kumu::Result_t::~Result_t((Result_t *)&local_208);
      if (local_388[0] != local_378) {
        operator_delete(local_388[0],(ulong)(local_378[0] + 1));
      }
      if (*(int *)this < 0) {
        if ((*(int *)this == ASDCP::RESULT_FORMAT) && (Options->showheader_flag == true)) {
          ASDCP::JP2K::MXFSReader::DumpHeaderMetadata((_IO_FILE *)auStack_398);
        }
      }
      else {
        fprintf(_stdout,"File essence type is %s.\n",type_string);
        if (Options->showheader_flag == true) {
          ASDCP::JP2K::MXFSReader::DumpHeaderMetadata((_IO_FILE *)auStack_398);
        }
        ASDCP::WriterInfo::WriterInfo((WriterInfo *)local_388);
        ASDCP::JP2K::MXFSReader::FillWriterInfo((WriterInfo *)(local_2d8 + 0x68));
        Kumu::Result_t::~Result_t((Result_t *)(local_2d8 + 0x68));
        ASDCP::WriterInfoDump((WriterInfo *)local_388,(_IO_FILE *)stream);
        local_208.EditRate.Numerator = 0;
        local_208.EditRate.Denominator = 0;
        local_208.SampleRate.Numerator = 0;
        local_208.SampleRate.Denominator = 0;
        local_208.AspectRatio.Numerator = 0;
        local_208.AspectRatio.Denominator = 0;
        ASDCP::JP2K::MXFSReader::FillPictureDescriptor((PictureDescriptor *)local_2d8);
        Kumu::Result_t::~Result_t((Result_t *)local_2d8);
        ASDCP::JP2K::PictureDescriptorDump(&local_208,(_IO_FILE *)stream);
        if (Options->showindex_flag == true) {
          ASDCP::JP2K::MXFSReader::DumpIndex((_IO_FILE *)auStack_398);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_p != &local_2f0) {
          operator_delete(local_300._M_p,local_2f0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_p != &local_310) {
          operator_delete(local_320._M_p,local_310._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_p != &local_330) {
          operator_delete(local_340._M_p,(ulong)(local_330._M_allocated_capacity + 1));
        }
      }
      ASDCP::JP2K::MXFSReader::~MXFSReader((MXFSReader *)auStack_398);
    }
    return this;
  }
  __assert_fail("type_string",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/asdcp-test.cpp"
                ,0x6f0,
                "static Result_t FileInfoWrapper<ASDCP::JP2K::MXFSReader, MyStereoPictureDescriptor>::file_info(CommandOptions &, const char *, const Kumu::IFileReaderFactory &, FILE *) [ReaderT = ASDCP::JP2K::MXFSReader, DescriptorT = MyStereoPictureDescriptor]"
               );
}

Assistant:

static Result_t
  file_info(CommandOptions& Options, const char* type_string, const Kumu::IFileReaderFactory& fileReaderFactory, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      stream = stdout;

    Result_t result = RESULT_OK;

    if ( Options.verbose_flag || Options.showheader_flag )
      {
	ReaderT     Reader(fileReaderFactory);
	result = Reader.OpenRead(Options.filenames[0]);

	if ( ASDCP_SUCCESS(result) )
	  {
	    fprintf(stdout, "File essence type is %s.\n", type_string);

	    if ( Options.showheader_flag )
	      Reader.DumpHeaderMetadata(stream);

	    WriterInfo WI;
	    Reader.FillWriterInfo(WI);
	    WriterInfoDump(WI, stream);

	    DescriptorT Desc;
	    Desc.FillDescriptor(Reader);
	    Desc.Dump(stream);

	    if ( Options.showindex_flag )
	      Reader.DumpIndex(stream);
	  }
	else if ( result == RESULT_FORMAT && Options.showheader_flag )
	  {
	    Reader.DumpHeaderMetadata(stream);
	  }
      }

    return result;
  }